

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall Assimp::OpenGEX::OpenGEXImporter::~OpenGEXImporter(OpenGEXImporter *this)

{
  long lVar1;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0071f5f0;
  this->m_ctx = (Context *)0x0;
  std::
  vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
  ::~vector(&this->m_unresolvedRefStack);
  std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base
            (&(this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>);
  std::_Vector_base<aiLight_*,_std::allocator<aiLight_*>_>::~_Vector_base
            (&(this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>);
  std::_Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>::~_Vector_base
            (&(this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>);
  std::_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~_Vector_base
            (&(this->m_materialCache).
              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>);
  VertexContainer::~VertexContainer(&this->m_currentVertices);
  lVar1 = 0x1a8;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&(this->super_BaseImporter)._vptr_BaseImporter + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != 0x108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->m_material2refMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->m_mesh2refMap)._M_t);
  std::
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ::~vector(&this->m_meshCache);
  std::
  _Rb_tree<aiNode_*,_std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>,_std::_Select1st<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
  ::~_Rb_tree(&(this->m_nodeChildMap)._M_t);
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

OpenGEXImporter::~OpenGEXImporter() {
    m_ctx = nullptr;
}